

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::InitSCCImpl(SCCInfoBase *scc)

{
  int iVar1;
  id iVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (InitSCCImpl(google::protobuf::internal::SCCInfoBase*)::runner == '\0') {
    InitSCCImpl();
  }
  iVar2._M_thread = pthread_self();
  if (InitSCCImpl::runner._M_i._M_thread == (id)iVar2._M_thread) {
    if ((scc->visit_status).super___atomic_base<int>._M_i != 1) {
      LogMessage::LogMessage
                (&local_48,LOGLEVEL_FATAL,
                 "third_party/sentencepiece/third_party/protobuf-lite/generated_message_util.cc",
                 0x311);
      other = LogMessage::operator<<
                        (&local_48,
                         "CHECK failed: (scc->visit_status.load(std::memory_order_relaxed)) == (SCCInfoBase::kRunning): "
                        );
      LogFinisher::operator=(&local_49,other);
      LogMessage::~LogMessage(&local_48);
    }
    return;
  }
  if ((init_protobuf_defaults_state & 1) == 0) {
    InitProtobufDefaultsSlow();
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&InitSCCImpl::mu);
  if (iVar1 == 0) {
    InitSCCImpl::runner._M_i._M_thread = (id)(id)iVar2._M_thread;
    anon_unknown_207::InitSCC_DFS(scc);
    InitSCCImpl::runner._M_i._M_thread = (id)0;
    pthread_mutex_unlock((pthread_mutex_t *)&InitSCCImpl::mu);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void InitSCCImpl(SCCInfoBase* scc) {
  static WrappedMutex mu{GOOGLE_PROTOBUF_LINKER_INITIALIZED};
  // Either the default in case no initialization is running or the id of the
  // thread that is currently initializing.
#ifndef GOOGLE_PROTOBUF_SUPPORT_WINDOWS_XP
  static std::atomic<std::thread::id> runner;
  auto me = std::this_thread::get_id();
#else
  // This is a lightweight replacement for std::thread::id. std::thread does not
  // work on Windows XP SP2 with the latest VC++ libraries, because it utilizes
  // the Concurrency Runtime that is only supported on Windows XP SP3 and above.
  static std::atomic_llong runner(-1);
  auto me = ::GetCurrentThreadId();
#endif  // #ifndef GOOGLE_PROTOBUF_SUPPORT_WINDOWS_XP

  // This will only happen because the constructor will call InitSCC while
  // constructing the default instance.
  if (runner.load(std::memory_order_relaxed) == me) {
    // Because we're in the process of constructing the default instance.
    // We can be assured that we're already exploring this SCC.
    GOOGLE_CHECK_EQ(scc->visit_status.load(std::memory_order_relaxed),
             SCCInfoBase::kRunning);
    return;
  }
  InitProtobufDefaults();
  mu.Lock();
  runner.store(me, std::memory_order_relaxed);
  InitSCC_DFS(scc);

#ifndef GOOGLE_PROTOBUF_SUPPORT_WINDOWS_XP
  runner.store(std::thread::id{}, std::memory_order_relaxed);
#else
  runner.store(-1, std::memory_order_relaxed);
#endif  // #ifndef GOOGLE_PROTOBUF_SUPPORT_WINDOWS_XP

  mu.Unlock();
}